

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

float * stbi__loadf_main(stbi__context *s,int *x,int *y,int *comp,int req_comp)

{
  int a;
  int b;
  int iVar1;
  float *pfVar2;
  uchar *__ptr;
  int *piVar3;
  uint uVar4;
  ulong uVar5;
  float *pfVar6;
  float *pfVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  stbi__result_info *in_R9;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  float *pfVar14;
  uchar *puVar15;
  ulong uVar16;
  ulong uVar17;
  float fVar18;
  
  uVar11 = (ulong)(uint)req_comp;
  iVar1 = stbi__hdr_test(s);
  if (iVar1 == 0) {
    piVar3 = comp;
    iVar1 = req_comp;
    __ptr = stbi__load_and_postprocess_8bit(s,x,y,comp,req_comp);
    if (__ptr == (uchar *)0x0) {
      stbi__g_failure_reason = "unknown image type";
    }
    else {
      a = *x;
      b = *y;
      if (req_comp == 0) {
        req_comp = *comp;
      }
      pfVar2 = (float *)stbi__malloc_mad4(a,b,req_comp,(int)piVar3,iVar1);
      if (pfVar2 != (float *)0x0) {
        uVar13 = (req_comp + (req_comp & 1U)) - 1;
        uVar4 = b * a;
        uVar11 = 0;
        if ((int)uVar13 < 1) {
          uVar13 = 0;
        }
        lVar10 = (long)req_comp;
        if ((int)uVar4 < 1) {
          uVar4 = 0;
        }
        pfVar7 = pfVar2;
        puVar15 = __ptr;
        for (; uVar11 != uVar4; uVar11 = uVar11 + 1) {
          for (uVar17 = 0; uVar13 != uVar17; uVar17 = uVar17 + 1) {
            fVar18 = powf((float)puVar15[uVar17] / 255.0,stbi__l2h_gamma);
            pfVar7[uVar17] = fVar18 * stbi__l2h_scale;
          }
          if ((int)uVar13 < req_comp) {
            lVar8 = uVar11 * lVar10 + (ulong)uVar13;
            pfVar2[lVar8] = (float)__ptr[lVar8] / 255.0;
          }
          pfVar7 = pfVar7 + lVar10;
          puVar15 = puVar15 + lVar10;
        }
        free(__ptr);
        return pfVar2;
      }
      free(__ptr);
      stbi__g_failure_reason = "outofmem";
    }
    pfVar2 = (float *)0x0;
  }
  else {
    pfVar2 = stbi__hdr_load(s,x,y,comp,req_comp,in_R9);
    if ((pfVar2 != (float *)0x0) && (stbi__vertically_flip_on_load != 0)) {
      uVar13 = *x;
      if (req_comp == 0) {
        uVar11 = (ulong)(uint)*comp;
      }
      uVar4 = *y >> 1;
      uVar9 = 0;
      uVar17 = 0;
      if (0 < (int)uVar11) {
        uVar17 = uVar11;
      }
      lVar10 = (long)(int)uVar11;
      uVar11 = 0;
      if (0 < (int)uVar13) {
        uVar11 = (ulong)uVar13;
      }
      uVar5 = (ulong)uVar4;
      if ((int)uVar4 < 1) {
        uVar5 = uVar9;
      }
      iVar1 = (*y + -1) * uVar13;
      pfVar7 = pfVar2;
      for (; uVar9 != uVar5; uVar9 = uVar9 + 1) {
        pfVar6 = (float *)((long)iVar1 * lVar10 * 4 + (long)pfVar2);
        pfVar14 = pfVar7;
        for (uVar16 = 0; uVar16 != uVar11; uVar16 = uVar16 + 1) {
          for (uVar12 = 0; uVar17 != uVar12; uVar12 = uVar12 + 1) {
            fVar18 = pfVar14[uVar12];
            pfVar14[uVar12] = pfVar6[uVar12];
            pfVar6[uVar12] = fVar18;
          }
          pfVar6 = pfVar6 + lVar10;
          pfVar14 = pfVar14 + lVar10;
        }
        iVar1 = iVar1 - uVar13;
        pfVar7 = pfVar7 + lVar10 * (int)uVar13;
      }
    }
  }
  return pfVar2;
}

Assistant:

static float *stbi__loadf_main(stbi__context *s, int *x, int *y, int *comp, int req_comp)
{
   unsigned char *data;
   #ifndef STBI_NO_HDR
   if (stbi__hdr_test(s)) {
      stbi__result_info ri;
      float *hdr_data = stbi__hdr_load(s,x,y,comp,req_comp, &ri);
      if (hdr_data)
         stbi__float_postprocess(hdr_data,x,y,comp,req_comp);
      return hdr_data;
   }
   #endif
   data = stbi__load_and_postprocess_8bit(s, x, y, comp, req_comp);
   if (data)
      return stbi__ldr_to_hdr(data, *x, *y, req_comp ? req_comp : *comp);
   return stbi__errpf("unknown image type", "Image not of any known type, or corrupt");
}